

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O0

int is_uncompressed(char *base58,uchar *bytes,size_t len,size_t *uncompressed)

{
  size_t *local_40;
  size_t written;
  size_t *psStack_30;
  int ret;
  size_t *uncompressed_local;
  size_t len_local;
  uchar *bytes_local;
  char *base58_local;
  
  psStack_30 = uncompressed;
  uncompressed_local = (size_t *)len;
  len_local = (size_t)bytes;
  bytes_local = (uchar *)base58;
  base58_local._4_4_ = wally_base58_to_bytes(base58,1,bytes,len,(size_t *)&local_40);
  if (base58_local._4_4_ == 0) {
    if (uncompressed_local < local_40) {
      base58_local._4_4_ = -2;
    }
    else if (local_40 == (size_t *)0x21) {
      *psStack_30 = 1;
      base58_local._4_4_ = 0;
    }
    else if ((local_40 == (size_t *)0x22) && (*(char *)(len_local + 0x21) == '\x01')) {
      *psStack_30 = 0;
      base58_local._4_4_ = 0;
    }
    else {
      base58_local._4_4_ = -2;
    }
  }
  return base58_local._4_4_;
}

Assistant:

static int is_uncompressed(const char *base58, unsigned char *bytes, size_t len, size_t *uncompressed)
{
    int ret;
    size_t written;

    if ((ret = wally_base58_to_bytes(base58, BASE58_FLAG_CHECKSUM, bytes, len, &written)))
        return ret;

    if (written > len)
        return WALLY_EINVAL; /** Not enough space for decoded WIF string */

    if (written == EC_PRIVATE_KEY_LEN + 1) {
        *uncompressed = 1;
        return WALLY_OK;
    } else if ((written == EC_PRIVATE_KEY_LEN + 2) && bytes[EC_PRIVATE_KEY_LEN + 1] == 0x01) {
        *uncompressed = 0;
        return WALLY_OK;
    }

    return WALLY_EINVAL;
}